

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Print.H
# Opt level: O3

void __thiscall amrex::AllPrint::AllPrint(AllPrint *this,ostream *os_)

{
  ostream *poVar1;
  
  (this->super_Print).rank = -1;
  (this->super_Print).comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
  (this->super_Print).os = os_;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&(this->super_Print).ss);
  poVar1 = (this->super_Print).os;
  *(undefined8 *)
   (&(this->super_Print).field_0x18 + *(long *)(*(long *)&(this->super_Print).ss + -0x18)) =
       *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 8);
  return;
}

Assistant:

explicit AllPrint (std::ostream& os_ = amrex::OutStream())
            : Print(Print::AllProcs, os_)
            {}